

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStream * Catch::makeStream(StringRef *filename)

{
  StringRef *this;
  bool bVar1;
  char cVar2;
  CoutStream *this_00;
  DebugOutStream *this_01;
  ReusableStringStream *pRVar3;
  FileStream *this_02;
  ReusableStringStream local_70;
  string local_58;
  StringRef local_38 [2];
  StringRef *local_18;
  StringRef *filename_local;
  
  local_18 = filename;
  bVar1 = StringRef::empty(filename);
  if (bVar1) {
    this_00 = (CoutStream *)operator_new(0x118);
    Detail::anon_unknown_0::CoutStream::CoutStream(this_00);
    filename_local = (StringRef *)this_00;
  }
  else {
    cVar2 = StringRef::operator[](local_18,0);
    this = local_18;
    if (cVar2 == '%') {
      StringRef::StringRef(local_38,"%debug");
      bVar1 = StringRef::operator==(this,local_38);
      if (!bVar1) {
        ReusableStringStream::ReusableStringStream(&local_70);
        pRVar3 = ReusableStringStream::operator<<
                           (&local_70,(char (*) [23])"Unrecognised stream: \'");
        pRVar3 = ReusableStringStream::operator<<(pRVar3,local_18);
        pRVar3 = ReusableStringStream::operator<<(pRVar3,(char (*) [2])0x1f9c02);
        ReusableStringStream::str_abi_cxx11_(&local_58,pRVar3);
        throw_domain_error(&local_58);
      }
      this_01 = (DebugOutStream *)operator_new(0x120);
      Detail::anon_unknown_0::DebugOutStream::DebugOutStream(this_01);
      filename_local = (StringRef *)this_01;
    }
    else {
      this_02 = (FileStream *)operator_new(0x208);
      Detail::anon_unknown_0::FileStream::FileStream(this_02,*local_18);
      filename_local = (StringRef *)this_02;
    }
  }
  return (IStream *)filename_local;
}

Assistant:

auto makeStream( StringRef const &filename ) -> IStream const* {
        if( filename.empty() )
            return new Detail::CoutStream();
        else if( filename[0] == '%' ) {
            if( filename == "%debug" )
                return new Detail::DebugOutStream();
            else
                CATCH_ERROR( "Unrecognised stream: '" << filename << "'" );
        }
        else
            return new Detail::FileStream( filename );
    }